

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

IceTVoid * rtsi_generateDataFunc(IceTInt id,IceTInt dest,IceTSizeType *size)

{
  IceTVoid *local_38;
  IceTVoid *outBuffer;
  IceTInt *tile_list;
  IceTSizeType *pIStack_20;
  IceTInt rank;
  IceTSizeType *size_local;
  IceTInt dest_local;
  IceTInt id_local;
  
  pIStack_20 = size;
  size_local._0_4_ = dest;
  size_local._4_4_ = id;
  outBuffer = icetUnsafeStateGetInteger(0x87);
  icetGetIntegerv(2,(IceTInt *)((long)&tile_list + 4));
  if ((IceTInt)size_local == tile_list._4_4_) {
    icetGetCompressedTileImage
              (*(IceTInt *)((long)outBuffer + (long)size_local._4_4_ * 4),rtsi_workingImage);
    *pIStack_20 = 0;
    _dest_local = (IceTVoid *)0x0;
  }
  else {
    icetGetCompressedTileImage
              (*(IceTInt *)((long)outBuffer + (long)size_local._4_4_ * 4),rtsi_outSparseImage);
    icetSparseImagePackageForSend(rtsi_outSparseImage,&local_38,pIStack_20);
    _dest_local = local_38;
  }
  return _dest_local;
}

Assistant:

static IceTVoid *rtsi_generateDataFunc(IceTInt id, IceTInt dest,
                                       IceTSizeType *size) {
    IceTInt rank;
    const IceTInt *tile_list
        = icetUnsafeStateGetInteger(ICET_CONTAINED_TILES_LIST);
    IceTVoid *outBuffer;

    icetGetIntegerv(ICET_RANK, &rank);
    if (dest == rank) {
      /* Special case: sending to myself.
         Just get directly to color and depth buffers. */
        icetGetCompressedTileImage(tile_list[id], rtsi_workingImage);
        *size = 0;
        return NULL;
    }
    icetGetCompressedTileImage(tile_list[id], rtsi_outSparseImage);
    icetSparseImagePackageForSend(rtsi_outSparseImage, &outBuffer, size);
    return outBuffer;
}